

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fglrx.c
# Opt level: O0

void decode_fglrx_ioctl_a6(fglrx_ioctl_a6 *d,mmt_memory_dump *args,int argc)

{
  int iVar1;
  mmt_buf *local_48;
  mmt_buf *__ret_1;
  mmt_buf *data2;
  mmt_buf *local_30;
  mmt_buf *__ret;
  mmt_buf *data1;
  int argc_local;
  mmt_memory_dump *args_local;
  fglrx_ioctl_a6 *d_local;
  
  if ((d->unk00 != 0) || (iVar1 = _fglrx_field_enabled("unk00"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk00: 0x%08x",fglrx_pfx,(ulong)d->unk00);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk04 != 0) || (iVar1 = _fglrx_field_enabled("unk04"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk04: 0x%08x",fglrx_pfx,(ulong)d->unk04);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->len1 != 0) || (iVar1 = _fglrx_field_enabled("len1"), iVar1 != 0)) {
    fprintf(_stdout,"%slen1: %d",fglrx_pfx,(ulong)d->len1);
  }
  fglrx_pfx = fglrx_sep;
  if (d->_pad0c != 0) {
    fprintf(_stdout,"%s%s_pad0c: 0x%08x%s",fglrx_sep,colors->err,(ulong)d->_pad0c,colors->reset);
  }
  fglrx_pfx = fglrx_sep;
  local_30 = (mmt_buf *)0x0;
  if ((d->ptr1 != 0) || (iVar1 = _fglrx_field_enabled("ptr1"), iVar1 != 0)) {
    if (d->ptr1 == 0) {
      fprintf(_stdout,"%sptr1: %s",fglrx_pfx,"NULL");
    }
    else {
      fprintf(_stdout,"%sptr1: 0x%016lx",fglrx_pfx,d->ptr1);
      if (0 < argc) {
        local_30 = find_ptr(d->ptr1,args,argc);
      }
      if (local_30 == (mmt_buf *)0x0) {
        fprintf(_stdout,"%s"," [no data]");
      }
    }
  }
  fglrx_pfx = fglrx_sep;
  if ((d->len2 != 0) || (iVar1 = _fglrx_field_enabled("len2"), iVar1 != 0)) {
    fprintf(_stdout,"%slen2: %d",fglrx_pfx,(ulong)d->len2);
  }
  fglrx_pfx = fglrx_sep;
  if (d->_pad1c != 0) {
    fprintf(_stdout,"%s%s_pad1c: 0x%08x%s",fglrx_sep,colors->err,(ulong)d->_pad1c,colors->reset);
  }
  fglrx_pfx = fglrx_sep;
  local_48 = (mmt_buf *)0x0;
  if ((d->ptr2 != 0) || (iVar1 = _fglrx_field_enabled("ptr2"), iVar1 != 0)) {
    if (d->ptr2 == 0) {
      fprintf(_stdout,"%sptr2: %s",fglrx_pfx,"NULL");
    }
    else {
      fprintf(_stdout,"%sptr2: 0x%016lx",fglrx_pfx,d->ptr2);
      if (0 < argc) {
        local_48 = find_ptr(d->ptr2,args,argc);
      }
      if (local_48 == (mmt_buf *)0x0) {
        fprintf(_stdout,"%s"," [no data]");
      }
    }
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk28 != 0) || (iVar1 = _fglrx_field_enabled("unk28"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk28: 0x%08x",fglrx_pfx,(ulong)d->unk28);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk2c != 0) || (iVar1 = _fglrx_field_enabled("unk2c"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk2c: 0x%08x",fglrx_pfx,(ulong)d->unk2c);
  }
  fglrx_pfx = fglrx_sep;
  fprintf(_stdout,"\n");
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
  }
  if (local_30 != (mmt_buf *)0x0) {
    dump_mmt_buf_as_words_horiz(local_30,"ptr1[]:");
  }
  if (local_48 != (mmt_buf *)0x0) {
    dump_mmt_buf_as_words_horiz(local_48,"ptr2[]:");
  }
  return;
}

Assistant:

static void decode_fglrx_ioctl_a6(struct fglrx_ioctl_a6 *d, struct mmt_memory_dump *args, int argc)
{
	fglrx_print_x32(d, unk00);
	fglrx_print_x32(d, unk04);
	fglrx_print_d32(d, len1);
	fglrx_print_pad_x32(d, _pad0c);
	struct mmt_buf *data1 = fglrx_print_ptr(d, ptr1, args, argc);
	fglrx_print_d32(d, len2);
	fglrx_print_pad_x32(d, _pad1c);
	struct mmt_buf *data2 = fglrx_print_ptr(d, ptr2, args, argc);
	fglrx_print_x32(d, unk28);
	fglrx_print_x32(d, unk2c);
	mmt_log_cont_nl();

	if (data1)
		dump_mmt_buf_as_words_horiz(data1, "ptr1[]:");
	if (data2)
		dump_mmt_buf_as_words_horiz(data2, "ptr2[]:");
}